

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collectjson.cpp
# Opt level: O1

int collectJson(QStringList *jsonFiles,QString *outputFile,bool skipStdIn)

{
  FILE *pFVar1;
  bool bVar2;
  int iVar3;
  size_t __n;
  int __oflag;
  int __oflag_00;
  void *__buf;
  int iVar4;
  QString *name;
  long lVar5;
  char *pcVar6;
  long in_FS_OFFSET;
  QJsonArray allMetaObjects;
  QJsonDocument doc;
  QString local_d0;
  QIODevice local_b8;
  QJsonArray local_a0;
  QString local_98;
  QByteArray local_80;
  QArrayDataPointer<QString> local_68;
  QIODevice local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QHashSeed::setDeterministicGlobalSeed();
  local_48._vptr_QIODevice = (_func_int **)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d_ptr._M_t.
  super___uniq_ptr_impl<QIODevicePrivate,_std::default_delete<QIODevicePrivate>_>._M_t.
  super__Tuple_impl<0UL,_QIODevicePrivate_*,_std::default_delete<QIODevicePrivate>_>.
  super__Head_base<0UL,_QIODevicePrivate_*,_false>._M_head_impl =
       (__uniq_ptr_data<QIODevicePrivate,_std::default_delete<QIODevicePrivate>,_true,_true>)
       &DAT_aaaaaaaaaaaaaaaa;
  QFile::QFile((QFile *)&local_48);
  if ((outputFile->d).size == 0) {
    iVar3 = QFile::open((QFile *)&local_48,_stdout,2,0);
    if ((char)iVar3 != '\0') goto LAB_0010817a;
    collectJson();
  }
  else {
    QFile::setFileName((QFile *)&local_48,outputFile);
    iVar3 = QFile::open((QFile *)&local_48,(char *)0x2,__oflag);
    pFVar1 = _stderr;
    if ((char)iVar3 != '\0') {
LAB_0010817a:
      local_a0.a.d.ptr = (QExplicitlySharedDataPointer<QCborContainerPrivate>)&DAT_aaaaaaaaaaaaaaaa;
      QJsonArray::QJsonArray(&local_a0);
      if ((jsonFiles->d).size != 0 || skipStdIn) {
LAB_00108200:
        local_68.d = (jsonFiles->d).d;
        local_68.ptr = (jsonFiles->d).ptr;
        __n = (jsonFiles->d).size;
        if (&(local_68.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          (((QArrayData *)&((local_68.d)->super_QArrayData).ref_)->ref_)._q_value.
          super___atomic_base<int>._M_i =
               (((QArrayData *)&((local_68.d)->super_QArrayData).ref_)->ref_)._q_value.
               super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        local_68.size = __n;
        QtPrivate::QStringList_sort((QStringList *)&local_68,CaseSensitive);
        if (local_68.size != 0) {
          lVar5 = local_68.size * 0x18;
          name = local_68.ptr;
          do {
            local_b8._vptr_QIODevice = (_func_int **)&DAT_aaaaaaaaaaaaaaaa;
            local_b8.d_ptr._M_t.
            super___uniq_ptr_impl<QIODevicePrivate,_std::default_delete<QIODevicePrivate>_>._M_t.
            super__Tuple_impl<0UL,_QIODevicePrivate_*,_std::default_delete<QIODevicePrivate>_>.
            super__Head_base<0UL,_QIODevicePrivate_*,_false>._M_head_impl =
                 (__uniq_ptr_data<QIODevicePrivate,_std::default_delete<QIODevicePrivate>,_true,_true>
                  )&DAT_aaaaaaaaaaaaaaaa;
            QFile::QFile((QFile *)&local_b8,name);
            iVar3 = QFile::open((QFile *)&local_b8,(char *)0x1,__oflag_00);
            pFVar1 = _stderr;
            if ((char)iVar3 == '\0') {
              QString::toLocal8Bit_helper(&local_80,(QChar *)(name->d).ptr,(name->d).size);
              if (local_80.d.ptr == (char *)0x0) {
                local_80.d.ptr = "";
              }
              QIODevice::errorString(&local_d0,&local_b8);
              QString::toLocal8Bit_helper
                        ((QByteArray *)&local_98,(QChar *)local_d0.d.ptr,local_d0.d.size);
              if ((QChar *)local_98.d.ptr == (QChar *)0x0) {
                local_98.d.ptr = L"";
              }
              fprintf(pFVar1,"%s: Cannot open file for reading: %s\n",local_80.d.ptr,local_98.d.ptr)
              ;
              if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,1,0x10);
                }
              }
              if (&(local_d0.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_d0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_d0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if (((local_d0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate(&(local_d0.d.d)->super_QArrayData,2,0x10);
                }
              }
              if (&(local_80.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if (((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate(&(local_80.d.d)->super_QArrayData,1,0x10);
                }
              }
              QFile::~QFile((QFile *)&local_b8);
LAB_00108436:
              iVar4 = 1;
              goto LAB_0010843b;
            }
            bVar2 = readFromFile((QFile *)&local_b8,&local_a0);
            QFile::~QFile((QFile *)&local_b8);
            if (!bVar2) goto LAB_00108436;
            name = name + 1;
            lVar5 = lVar5 + -0x18;
          } while (lVar5 != 0);
        }
        local_98.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        QJsonDocument::QJsonDocument((QJsonDocument *)&local_98,&local_a0);
        iVar4 = 0;
        QJsonDocument::toJson(&local_80,(QJsonDocument *)&local_98,Indented);
        QIODevice::write(&local_48,(int)&local_80,__buf,__n);
        if (&(local_80.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_80.d.d)->super_QArrayData,1,0x10);
          }
        }
        QJsonDocument::~QJsonDocument((QJsonDocument *)&local_98);
LAB_0010843b:
        QArrayDataPointer<QString>::~QArrayDataPointer(&local_68);
      }
      else {
        local_68.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_68.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
        QFile::QFile((QFile *)&local_68);
        iVar4 = 1;
        iVar3 = QFile::open((QFile *)&local_68,_stdin,1,0);
        if ((char)iVar3 == '\0') {
          collectJson();
        }
        else {
          bVar2 = readFromFile((QFile *)&local_68,&local_a0);
          QFile::~QFile((QFile *)&local_68);
          if (bVar2) goto LAB_00108200;
        }
      }
      QJsonArray::~QJsonArray(&local_a0);
      goto LAB_0010844f;
    }
    QString::toLocal8Bit_helper
              ((QByteArray *)&local_68,(QChar *)(outputFile->d).ptr,(outputFile->d).size);
    pcVar6 = (char *)local_68.ptr;
    if (local_68.ptr == (QString *)0x0) {
      pcVar6 = "";
    }
    QIODevice::errorString(&local_98,&local_48);
    QString::toLocal8Bit_helper(&local_80,(QChar *)local_98.d.ptr,local_98.d.size);
    if (local_80.d.ptr == (char *)0x0) {
      local_80.d.ptr = "";
    }
    fprintf(pFVar1,"%s: Cannot open file for writing: %s\n",pcVar6,local_80.d.ptr);
    if (&(local_80.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_80.d.d)->super_QArrayData,1,0x10);
      }
    }
    if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_68.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_68.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_68.d)->super_QArrayData,1,0x10);
      }
    }
  }
  iVar4 = 1;
LAB_0010844f:
  QFile::~QFile((QFile *)&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar4;
  }
  __stack_chk_fail();
}

Assistant:

int collectJson(const QStringList &jsonFiles, const QString &outputFile, bool skipStdIn)
{
    QHashSeed::setDeterministicGlobalSeed();

    QFile output;
    if (outputFile.isEmpty()) {
        if (!output.open(stdout, QIODevice::WriteOnly)) {
            fprintf(stderr, "Error opening stdout for writing: %s\n",
                    qPrintable(output.errorString()));
            return EXIT_FAILURE;
        }
    } else {
        output.setFileName(outputFile);
        if (!output.open(QIODevice::WriteOnly)) {
            fprintf(stderr, "%s: Cannot open file for writing: %s\n", qPrintable(outputFile),
                    qPrintable(output.errorString()));
            return EXIT_FAILURE;
        }
    }

    QJsonArray allMetaObjects;
    if (jsonFiles.isEmpty() && !skipStdIn) {
        QFile f;
        if (!f.open(stdin, QIODevice::ReadOnly)) {
            fprintf(stderr, "Error opening stdin for reading: %s\n", qPrintable(f.errorString()));
            return EXIT_FAILURE;
        }

        if (!readFromFile(&f, &allMetaObjects))
            return EXIT_FAILURE;
    }

    QStringList jsonFilesSorted = jsonFiles;
    jsonFilesSorted.sort();
    for (const QString &jsonFile : std::as_const(jsonFilesSorted)) {
        QFile f(jsonFile);
        if (!f.open(QIODevice::ReadOnly)) {
            fprintf(stderr, "%s: Cannot open file for reading: %s\n", qPrintable(jsonFile),
                    qPrintable(f.errorString()));
            return EXIT_FAILURE;
        }

        if (!readFromFile(&f, &allMetaObjects))
            return EXIT_FAILURE;
    }

    QJsonDocument doc(allMetaObjects);
    output.write(doc.toJson());

    return EXIT_SUCCESS;
}